

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O0

void nn_cws_start_connecting(nn_cws *self,sockaddr_storage *ss,size_t sslen)

{
  void *pvVar1;
  void *in_RSI;
  long in_RDI;
  size_t sz;
  int val;
  int ipv4only;
  size_t locallen;
  sockaddr_storage local;
  size_t remotelen;
  sockaddr_storage remote;
  int rc;
  nn_backoff *self_00;
  long lVar2;
  nn_ep *self_01;
  nn_usock *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  nn_ep *in_stack_fffffffffffffee0;
  nn_usock *in_stack_fffffffffffffee8;
  short local_a0;
  uint16_t local_9e;
  int local_1c;
  void *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_a0,0,0x80);
  memset(&stack0xfffffffffffffed8,0,0x80);
  self_00 = (nn_backoff *)0x4;
  nn_ep_getopt(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
               (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (size_t *)in_stack_fffffffffffffec8);
  if (self_00 != (nn_backoff *)0x4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (ipv4only)",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
            ,0x264);
    fflush(_stderr);
    nn_err_abort();
  }
  pvVar1 = nn_chunkref_data((nn_chunkref *)(local_8 + 0x1c48));
  nn_chunkref_size((nn_chunkref *)self_00);
  local_1c = nn_iface_resolve((char *)in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0,
                              in_stack_fffffffffffffedc,
                              (sockaddr_storage *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              (size_t *)in_stack_fffffffffffffec8);
  if (local_1c < 0) {
    nn_backoff_start(self_00);
    *(undefined4 *)(local_8 + 0x58) = 8;
  }
  else {
    memcpy(&local_a0,local_10,0x80);
    if (local_a0 == 2) {
      local_9e = htons((uint16_t)*(undefined4 *)(local_8 + 0x1c68));
    }
    else {
      if (local_a0 != 10) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
                ,0x277);
        fflush(_stderr);
        nn_err_abort();
      }
      local_9e = htons((uint16_t)*(undefined4 *)(local_8 + 0x1c68));
    }
    local_1c = nn_usock_start(in_stack_fffffffffffffec8,(int)((ulong)self_00 >> 0x20),(int)self_00,
                              (int)((ulong)pvVar1 >> 0x20));
    if (local_1c < 0) {
      nn_backoff_start(self_00);
      *(undefined4 *)(local_8 + 0x58) = 8;
    }
    else {
      lVar2 = 4;
      nn_ep_getopt(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                   (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_t *)in_stack_fffffffffffffec8);
      if (lVar2 != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
                ,0x284);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffec8,4);
      self_01 = (nn_ep *)0x4;
      nn_ep_getopt(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                   (void *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   (size_t *)in_stack_fffffffffffffec8);
      if (self_01 != (nn_ep *)0x4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
                ,0x289);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                          in_stack_fffffffffffffed4,in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffec8,4);
      local_1c = nn_usock_bind(in_stack_fffffffffffffee8,(sockaddr *)in_stack_fffffffffffffee0,
                               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
      if (local_1c == 0) {
        nn_usock_connect((nn_usock *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (sockaddr *)in_stack_fffffffffffffec8,(size_t)self_01);
        *(undefined4 *)(local_8 + 0x58) = 4;
        nn_ep_stat_increment(self_01,(int)((ulong)pvVar1 >> 0x20),(int)pvVar1);
      }
      else {
        nn_backoff_start((nn_backoff *)self_01);
        *(undefined4 *)(local_8 + 0x58) = 8;
      }
    }
  }
  return;
}

Assistant:

static void nn_cws_start_connecting (struct nn_cws *self,
    struct sockaddr_storage *ss, size_t sslen)
{
    int rc;
    struct sockaddr_storage remote;
    size_t remotelen;
    struct sockaddr_storage local;
    size_t locallen;
    int ipv4only;
    int val;
    size_t sz;

    memset (&remote, 0, sizeof (remote));
    memset (&local, 0, sizeof (local));

    /*  Check whether IPv6 is to be used. */
    sz = sizeof (ipv4only);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_IPV4ONLY, &ipv4only, &sz);
    nn_assert (sz == sizeof (ipv4only));

    rc = nn_iface_resolve (nn_chunkref_data (&self->nic),
    nn_chunkref_size (&self->nic), ipv4only, &local, &locallen);

    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CWS_STATE_WAITING;
        return;
    }

    /*  Combine the remote address and the port. */
    remote = *ss;
    remotelen = sslen;
    if (remote.ss_family == AF_INET)
        ((struct sockaddr_in*) &remote)->sin_port = htons (self->remote_port);
    else if (remote.ss_family == AF_INET6)
        ((struct sockaddr_in6*) &remote)->sin6_port = htons (self->remote_port);
    else
        nn_assert (0);

    /*  Try to start the underlying socket. */
    rc = nn_usock_start (&self->usock, remote.ss_family, SOCK_STREAM, 0);
    if (nn_slow (rc < 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CWS_STATE_WAITING;
        return;
    }

    /*  Set the relevant socket options. */
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_SNDBUF,
        &val, sizeof (val));
    sz = sizeof (val);
    nn_ep_getopt (self->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
    nn_assert (sz == sizeof (val));
    nn_usock_setsockopt (&self->usock, SOL_SOCKET, SO_RCVBUF,
        &val, sizeof (val));

    /*  Bind the socket to the local network interface. */
    rc = nn_usock_bind (&self->usock, (struct sockaddr*) &local, locallen);
    if (nn_slow (rc != 0)) {
        nn_backoff_start (&self->retry);
        self->state = NN_CWS_STATE_WAITING;
        return;
    }

    /*  Start connecting. */
    nn_usock_connect (&self->usock, (struct sockaddr*) &remote, remotelen);
    self->state = NN_CWS_STATE_CONNECTING;
    nn_ep_stat_increment (self->ep, NN_STAT_INPROGRESS_CONNECTIONS, 1);
}